

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::ES5ArrayTypeHandlerBase<int>::ES5ArrayTypeHandlerBase
          (ES5ArrayTypeHandlerBase<int> *this,Recycler *recycler,
          ES5ArrayTypeHandlerBase<int> *typeHandler)

{
  IndexPropertyDescriptorMap *pIVar1;
  ES5ArrayTypeHandlerBase<int> *typeHandler_local;
  Recycler *recycler_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  DictionaryTypeHandlerBase<int>::DictionaryTypeHandlerBase
            (&this->super_DictionaryTypeHandlerBase<int>,recycler,
             &typeHandler->super_DictionaryTypeHandlerBase<int>);
  (this->super_DictionaryTypeHandlerBase<int>).super_DynamicTypeHandler._vptr_DynamicTypeHandler =
       (_func_int **)&PTR_GetCppName_01e471e8;
  Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::WriteBarrierPtr(&this->indexPropertyMap);
  this->dataItemAttributes = typeHandler->dataItemAttributes;
  this->lengthWritable = (Type)(typeHandler->lengthWritable & 1);
  pIVar1 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                     (&typeHandler->indexPropertyMap);
  pIVar1 = IndexPropertyDescriptorMap::Clone(pIVar1,recycler);
  Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator=(&this->indexPropertyMap,pIVar1)
  ;
  return;
}

Assistant:

ES5ArrayTypeHandlerBase<T>::ES5ArrayTypeHandlerBase(Recycler* recycler, ES5ArrayTypeHandlerBase<T>* typeHandler)
        : DictionaryTypeHandlerBase<T>(recycler, typeHandler)
    {
        dataItemAttributes = typeHandler->dataItemAttributes;
        lengthWritable = typeHandler->lengthWritable;
        indexPropertyMap = typeHandler->indexPropertyMap->Clone(recycler);
    }